

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QTzTransitionRule>::emplace<QTzTransitionRule_const&>
          (QPodArrayOps<QTzTransitionRule> *this,qsizetype i,QTzTransitionRule *args)

{
  undefined4 uVar1;
  long lVar2;
  undefined8 uVar3;
  bool bVar4;
  qsizetype qVar5;
  QTzTransitionRule *pQVar6;
  undefined8 *in_RDX;
  long in_RSI;
  QArrayDataPointer<QTzTransitionRule> *in_RDI;
  long in_FS_OFFSET;
  QTzTransitionRule *where;
  GrowthPosition pos;
  bool detach;
  QTzTransitionRule tmp;
  QArrayDataPointer<QTzTransitionRule> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 uVar8;
  QArrayDataPointer<QTzTransitionRule> *this_00;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar4 = QArrayDataPointer<QTzTransitionRule>::needsDetach(in_stack_ffffffffffffffc0);
  uVar8 = CONCAT13(bVar4,(int3)in_stack_ffffffffffffffcc);
  if (!bVar4) {
    if ((in_RSI == in_RDI->size) &&
       (qVar5 = QArrayDataPointer<QTzTransitionRule>::freeSpaceAtEnd
                          ((QArrayDataPointer<QTzTransitionRule> *)
                           CONCAT44(uVar8,in_stack_ffffffffffffffc8)), qVar5 != 0)) {
      pQVar6 = QArrayDataPointer<QTzTransitionRule>::end(in_stack_ffffffffffffffc0);
      uVar3 = *in_RDX;
      pQVar6->stdOffset = (int)uVar3;
      pQVar6->dstOffset = (int)((ulong)uVar3 >> 0x20);
      *(undefined4 *)&pQVar6->abbreviationIndex = *(undefined4 *)(in_RDX + 1);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0075f2c3;
    }
    if ((in_RSI == 0) &&
       (qVar5 = QArrayDataPointer<QTzTransitionRule>::freeSpaceAtBegin
                          ((QArrayDataPointer<QTzTransitionRule> *)
                           CONCAT44(uVar8,in_stack_ffffffffffffffc8)), qVar5 != 0)) {
      pQVar6 = QArrayDataPointer<QTzTransitionRule>::begin
                         ((QArrayDataPointer<QTzTransitionRule> *)0x75f1f4);
      uVar3 = *in_RDX;
      pQVar6[-1].stdOffset = (int)uVar3;
      pQVar6[-1].dstOffset = (int)((ulong)uVar3 >> 0x20);
      *(undefined4 *)&pQVar6[-1].abbreviationIndex = *(undefined4 *)(in_RDX + 1);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0075f2c3;
    }
  }
  uVar3 = *in_RDX;
  uVar1 = *(undefined4 *)(in_RDX + 1);
  uVar7 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar7 = 1;
  }
  QArrayDataPointer<QTzTransitionRule>::detachAndGrow
            (this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
             (QTzTransitionRule **)CONCAT44(uVar8,uVar7),in_stack_ffffffffffffffc0);
  pQVar6 = createHole((QPodArrayOps<QTzTransitionRule> *)this_00,
                      (GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
                      CONCAT44(uVar8,uVar7));
  pQVar6->stdOffset = (int)uVar3;
  pQVar6->dstOffset = (int)((ulong)uVar3 >> 0x20);
  *(undefined4 *)&pQVar6->abbreviationIndex = uVar1;
LAB_0075f2c3:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }